

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_RKCoeffs(MRIStepCoupling MRIC,int is,int *stage_map,realtype *Ae_row,realtype *Ai_row)

{
  double dVar1;
  realtype kconst;
  int k;
  int j;
  realtype *Ai_row_local;
  realtype *Ae_row_local;
  int *stage_map_local;
  int is_local;
  MRIStepCoupling MRIC_local;
  int local_4;
  
  if ((((is < 1) || (MRIC->stages <= is)) || (stage_map == (int *)0x0)) ||
     ((Ae_row == (realtype *)0x0 || (Ai_row == (realtype *)0x0)))) {
    local_4 = -0x29;
  }
  else {
    for (j = 0; j < MRIC->stages; j = j + 1) {
      Ae_row[j] = 0.0;
      Ai_row[j] = 0.0;
    }
    for (k = 0; k < MRIC->nmat; k = k + 1) {
      dVar1 = 1.0 / ((double)k + 1.0);
      if (MRIC->W != (realtype ***)0x0) {
        for (j = 0; j < is; j = j + 1) {
          if (-1 < stage_map[j]) {
            Ae_row[stage_map[j]] = MRIC->W[k][is][j] * dVar1 + Ae_row[stage_map[j]];
          }
        }
      }
      if (MRIC->G != (realtype ***)0x0) {
        for (j = 0; j <= is; j = j + 1) {
          if (-1 < stage_map[j]) {
            Ai_row[stage_map[j]] = MRIC->G[k][is][j] * dVar1 + Ai_row[stage_map[j]];
          }
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_RKCoeffs(MRIStepCoupling MRIC, int is, int *stage_map,
                     realtype *Ae_row, realtype *Ai_row)
{
  int j, k;
  realtype kconst;

  if (is < 1 || is >= MRIC->stages || !stage_map || !Ae_row || !Ai_row)
    return ARK_INVALID_TABLE;

  /* initialize RK coefficient array */
  for (j = 0; j < MRIC->stages; j++) {
    Ae_row[j] = ZERO;
    Ai_row[j] = ZERO;
  }

  /* compute RK coefficients */
  for (k = 0; k < MRIC->nmat; k++) {
    kconst = ONE/(k+ONE);
    if (MRIC->W) {
      for (j = 0; j < is; j++)
        if (stage_map[j] > -1)
          Ae_row[stage_map[j]] += (MRIC->W[k][is][j] * kconst);
    }
    if (MRIC->G) {
      for (j = 0; j <= is; j++)
        if (stage_map[j] > -1)
          Ai_row[stage_map[j]] += (MRIC->G[k][is][j] * kconst);
    }
  }

  return(ARK_SUCCESS);
}